

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void PruneBlockFilesManual(Chainstate *active_chainstate,int nManualPruneHeight)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *in_stack_ffffffffffffff80;
  _Alloc_hider in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  BlockValidationState state;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  bVar2 = Chainstate::FlushStateToDisk(active_chainstate,&state,NONE,nManualPruneHeight);
  if (!bVar2) {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffff88,
               &state.super_ValidationState<BlockValidationResult>);
    logging_function._M_str = "PruneBlockFilesManual";
    logging_function._M_len = 0x15;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp";
    source_file._M_len = 0x57;
    LogPrintf_<char[22],std::__cxx11::string>
              (logging_function,source_file,0x122d,
               I2P|VALIDATION|QT|COINDB|MEMPOOLREJ|PROXY|CMPCTBLOCK|ADDRMAN|ESTIMATEFEE|ZMQ|HTTP,
               (Level)(string *)&stack0xffffffffffffff88,in_stack_ffffffffffffff80,
               (char (*) [22])in_stack_ffffffffffffff88._M_p,in_stack_ffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  }
  ValidationState<BlockValidationResult>::~ValidationState
            (&state.super_ValidationState<BlockValidationResult>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PruneBlockFilesManual(Chainstate& active_chainstate, int nManualPruneHeight)
{
    BlockValidationState state;
    if (!active_chainstate.FlushStateToDisk(
            state, FlushStateMode::NONE, nManualPruneHeight)) {
        LogPrintf("%s: failed to flush state (%s)\n", __func__, state.ToString());
    }
}